

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder.cc
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerEncoder::ComputeNumberOfEncodedFaces(MeshEdgebreakerEncoder *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  undefined4 extraout_var;
  MeshEncoder *in_RDI;
  CornerTable *corner_table;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                      *)0x1924af);
  if (bVar1) {
    pMVar4 = std::
             unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
             ::operator->((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                           *)0x1924c6);
    iVar2 = (*pMVar4->_vptr_MeshEdgebreakerEncoderImplInterface[8])();
    if ((CornerTable *)CONCAT44(extraout_var,iVar2) != (CornerTable *)0x0) {
      iVar3 = CornerTable::num_faces((CornerTable *)0x1924e8);
      iVar2 = CornerTable::NumDegeneratedFaces((CornerTable *)CONCAT44(extraout_var,iVar2));
      MeshEncoder::set_num_encoded_faces(in_RDI,(long)(iVar3 - iVar2));
    }
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoder::ComputeNumberOfEncodedFaces() {
  if (!impl_) {
    return;
  }
  const CornerTable *const corner_table = impl_->GetCornerTable();
  if (!corner_table) {
    return;
  }
  set_num_encoded_faces(corner_table->num_faces() -
                        corner_table->NumDegeneratedFaces());
}